

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

void __thiscall
EDLines::EDLines(EDLines *this,Mat *srcImage,double _line_error,int _min_line_len,
                double _max_distance_between_two_lines,double _max_error)

{
  undefined8 *puVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pLVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  ulong uVar8;
  double *x;
  double *y;
  NFALUT *pNVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  pointer *ppPVar14;
  long lVar15;
  pointer pvVar16;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> segment;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,srcImage);
  ED::ED(&this->super_ED,local_90,SOBEL_OPERATOR,0x24,8,1,10,1.0,true);
  cv::Mat::~Mat(local_90);
  (this->linePoints).super__Vector_base<LS,_std::allocator<LS>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->linePoints).super__Vector_base<LS,_std::allocator<LS>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->invalidLines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->invalidLines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->invalidLines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->linePoints).super__Vector_base<LS,_std::allocator<LS>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->min_line_len = _min_line_len;
  this->line_error = _line_error;
  this->max_distance_between_two_lines = _max_distance_between_two_lines;
  this->max_error = _max_error;
  if (_min_line_len == -1) {
    _min_line_len = ComputeMinLineLength(this);
    this->min_line_len = _min_line_len;
  }
  if (_min_line_len < 9) {
    this->min_line_len = 9;
  }
  uVar8 = ((long)(this->super_ED).height + (long)(this->super_ED).width) * 8;
  pvVar16 = (this->super_ED).segmentPoints.
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->super_ED).segmentPoints.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)pvVar3 - (long)pvVar16;
  if (lVar11 != 0) {
    lVar11 = (lVar11 >> 3) * -0x5555555555555555;
    lVar11 = lVar11 + (ulong)(lVar11 == 0);
    ppPVar14 = &(pvVar16->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    do {
      uVar13 = (long)*ppPVar14 - (long)((_Vector_impl_data *)(ppPVar14 + -1))->_M_start >> 3;
      if (uVar13 < uVar8) {
        uVar13 = uVar8;
      }
      uVar8 = uVar13;
      ppPVar14 = ppPVar14 + 3;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  uVar8 = -(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3;
  x = (double *)operator_new__(uVar8);
  y = (double *)operator_new__(uVar8);
  this->linesNo = 0;
  if (pvVar3 != pvVar16) {
    uVar8 = 0;
    do {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                (&segment,pvVar16 + uVar8);
      lVar11 = (long)segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if (segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar15 = 0;
        do {
          x[lVar15] = (double)segment.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar15].x;
          y[lVar15] = (double)segment.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar15].y;
          lVar15 = lVar15 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar15);
      }
      SplitSegment2Lines(this,x,y,(int)lVar11,(int)uVar8);
      if (segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(segment.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar8 = uVar8 + 1;
      pvVar16 = (this->super_ED).segmentPoints.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = ((long)(this->super_ED).segmentPoints.
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar16 >> 3) *
               -0x5555555555555555;
    } while (uVar8 <= uVar13 && uVar13 - uVar8 != 0);
  }
  JoinCollinearLines(this);
  this->prec = 0.39269908169872414;
  dVar5 = log10((double)(this->super_ED).width);
  dVar6 = log10((double)(this->super_ED).height);
  iVar10 = (this->super_ED).width;
  iVar12 = (this->super_ED).height;
  pNVar9 = (NFALUT *)operator_new(0x20);
  iVar7 = iVar12 + iVar10;
  iVar10 = iVar12 + 7 + iVar10;
  if (-1 < iVar7) {
    iVar10 = iVar7;
  }
  NFALUT::NFALUT(pNVar9,iVar10 >> 3,0.125,dVar5 + dVar6 + dVar5 + dVar6);
  this->nfa = pNVar9;
  ValidateLineSegments(this);
  pLVar4 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar10 = (int)((ulong)((long)pLVar4 -
                        (long)(this->lines).
                              super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  iVar12 = iVar10 * 0x38e38e39;
  uVar2 = this->linesNo;
  if (SBORROW4(uVar2,iVar12) != (int)(uVar2 + iVar10 * -0x38e38e39) < 0) {
    (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar4 + (-1 - (ulong)(~uVar2 + iVar12));
  }
  if (0 < (int)uVar2) {
    lVar15 = 0x28;
    lVar11 = 0;
    do {
      pLVar4 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)((long)pLVar4 + lVar15 + -0x10);
      segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar1;
      segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar1[1];
      segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&pLVar4->a + lVar15);
      std::vector<LS,_std::allocator<LS>_>::emplace_back<LS>(&this->linePoints,(LS *)&segment);
      lVar11 = lVar11 + 1;
      lVar15 = lVar15 + 0x48;
    } while (lVar11 < this->linesNo);
  }
  operator_delete__(x);
  operator_delete__(y);
  pNVar9 = this->nfa;
  if (pNVar9 != (NFALUT *)0x0) {
    NFALUT::~NFALUT(pNVar9);
  }
  operator_delete(pNVar9);
  return;
}

Assistant:

EDLines::EDLines(Mat srcImage ,  double _line_error, int _min_line_len, double _max_distance_between_two_lines , double _max_error)
	:ED(srcImage, SOBEL_OPERATOR, 36, 8) 
{
	min_line_len = _min_line_len;
	line_error = _line_error;
	max_distance_between_two_lines = _max_distance_between_two_lines;
	max_error = _max_error;

	if(min_line_len == -1) // If no initial value given, compute it 
		min_line_len = ComputeMinLineLength();

	if (min_line_len < 9) // avoids small line segments in the result. Might be deleted!
		min_line_len = 9;



	// Temporary buffers used during line fitting
	size_t buffer_size = (width + height) * 8;
	for (int segmentNumber = 0; segmentNumber < segmentPoints.size(); segmentNumber++) {
		auto segment_size = segmentPoints[segmentNumber].size();
		buffer_size = std::max(buffer_size, segment_size);
	}
	double* x = new double[buffer_size];
	double* y = new double[buffer_size];

	linesNo = 0;
	
	// Use the whole segment
	for (int segmentNumber = 0; segmentNumber < segmentPoints.size(); segmentNumber++) {
		int k = 0;
		std::vector<Point> segment = segmentPoints[segmentNumber];
		for (int k = 0; k < segment.size(); k++) {
			x[k] = segment[k].x;
			y[k] = segment[k].y;
		}
		SplitSegment2Lines(x, y, (int)segment.size(), segmentNumber);
	}

	/*----------- JOIN COLLINEAR LINES ----------------*/
	JoinCollinearLines();

	/*----------- VALIDATE LINES ----------------*/
#define PRECISON_ANGLE 22.5 
	prec = (PRECISON_ANGLE / 180)*M_PI;
	double prob = 0.125;
#undef PRECISON_ANGLE

	double logNT = 2.0*(log10((double)width) + log10((double)height));

	int lutSize = (width + height) / 8;
	nfa = new NFALUT(lutSize, prob, logNT); // create look up table
	
	ValidateLineSegments();

	// Delete redundant space from lines
	// Pop them back
	int size = (int)lines.size();
	for (int i = 1; i <= size - linesNo; i++)
		lines.pop_back();
	
	for (int i = 0; i<linesNo; i++) {
		Point2d start(lines[i].sx, lines[i].sy);
		Point2d end(lines[i].ex, lines[i].ey);
		
		linePoints.push_back(LS(start, end));
	} //end-for

	delete[] x;
	delete[] y;
	delete nfa;
}